

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

int Gia_ManSopToAig(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  long lVar1;
  int iVar2;
  int iLit1;
  uint iLit0;
  byte bVar3;
  uint iLit1_00;
  char *pcVar4;
  long lVar5;
  
  iVar2 = Kit_PlaGetVarNum(pSop);
  bVar3 = *pSop;
  if (bVar3 == 0) {
    iVar2 = Kit_PlaIsComplement(pSop);
    iLit0 = 0;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iLit0 = 0;
    pcVar4 = pSop;
    do {
      iLit1 = 1;
      lVar5 = 0;
      while ((bVar3 & 0xdf) != 0) {
        if (vLeaves->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iLit1_00 = vLeaves->pArray[lVar5];
        if ((int)iLit1_00 < 0) {
          __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                        ,0x54,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
        }
        if (bVar3 != 0x2d) {
          if (bVar3 != 0x31) {
            if (bVar3 != 0x30) {
              __assert_fail("Value == \'-\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                            ,0x59,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
            }
            iLit1_00 = iLit1_00 ^ 1;
          }
          iLit1 = Gia_ManHashAnd(p,iLit1,iLit1_00);
        }
        lVar1 = lVar5 + 1;
        lVar5 = lVar5 + 1;
        bVar3 = pcVar4[lVar1];
      }
      iLit0 = Gia_ManHashOr(p,iLit0,iLit1);
      bVar3 = pcVar4[iVar2 + 3];
      pcVar4 = pcVar4 + (iVar2 + 3);
    } while (bVar3 != 0);
    iVar2 = Kit_PlaIsComplement(pSop);
    if (iVar2 == 0) {
      return iLit0;
    }
    if ((int)iLit0 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
  }
  return iLit0 ^ 1;
}

Assistant:

int Gia_ManSopToAig( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    int i, iAnd, iSum, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Kit_PlaGetVarNum(pSop);
    // go through the cubes of the node's SOP
    iSum = 0;
    Kit_PlaForEachCube( pSop, nFanins, pCube )
    {
        // create the AND of literals
        iAnd = 1;
        Kit_PlaCubeForEachVar( pCube, Value, i )
        {
            assert( Vec_IntEntry(vLeaves, i) >= 0 );
            if ( Value == '1' )
                iAnd = Gia_ManHashAnd( p, iAnd, Vec_IntEntry(vLeaves, i) );
            else if ( Value == '0' )
                iAnd = Gia_ManHashAnd( p, iAnd, Abc_LitNot(Vec_IntEntry(vLeaves, i)) );
            else assert( Value == '-' );
        }
        // add to the sum of cubes
        iSum = Gia_ManHashOr( p, iSum, iAnd );
    }
    // decide whether to complement the result
    if ( Kit_PlaIsComplement(pSop) )
        iSum = Abc_LitNot(iSum);
    return iSum;
}